

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::CacheHeaderTestInstance::CacheHeaderTestInstance
          (CacheHeaderTestInstance *this,Context *context,CacheTestParam *param)

{
  deUint32 dVar1;
  size_t sVar2;
  DeviceInterface *pDVar3;
  VkResult VVar4;
  int iVar5;
  VkDevice pVVar6;
  Handle<(vk::HandleType)15> *pHVar7;
  TestError *pTVar8;
  deUint8 *pdVar9;
  VkPhysicalDeviceProperties *pVVar10;
  ulong local_48;
  size_t dataSize;
  VkDevice vkDevice;
  DeviceInterface *local_28;
  DeviceInterface *vk;
  CacheTestParam *param_local;
  Context *context_local;
  CacheHeaderTestInstance *this_local;
  
  vk = (DeviceInterface *)param;
  param_local = (CacheTestParam *)context;
  context_local = (Context *)this;
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (&this->super_GraphicsCacheTestInstance,context,param);
  (this->super_GraphicsCacheTestInstance).super_CacheTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__CacheHeaderTestInstance_0165fc50;
  this->m_data = (deUint8 *)0x0;
  local_28 = Context::getDeviceInterface
                       ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                        super_TestInstance.m_context);
  pVVar6 = Context::getDevice((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                              super_TestInstance.m_context);
  pDVar3 = local_28;
  local_48 = 0;
  dataSize = (size_t)pVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  VVar4 = (*pDVar3->_vptr_DeviceInterface[0x2e])(pDVar3,pVVar6,pHVar7->m_internal,&local_48,0);
  ::vk::checkResult(VVar4,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x6ad);
  if (local_48 < 0x20) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Pipeline cache size is smaller than header size",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6b0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pdVar9 = (deUint8 *)operator_new__(local_48);
  pDVar3 = local_28;
  sVar2 = dataSize;
  this->m_data = pdVar9;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  VVar4 = (*pDVar3->_vptr_DeviceInterface[0x2e])
                    (pDVar3,sVar2,pHVar7->m_internal,&local_48,this->m_data);
  ::vk::checkResult(VVar4,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x6b4);
  ::deMemcpy(&this->m_header,this->m_data,0x20);
  if ((this->m_header).HeaderLength != 0x20) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid header size!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6b9);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((this->m_header).HeaderVersion != 1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid header version!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6bc);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar1 = (this->m_header).VendorID;
  pVVar10 = Context::getDeviceProperties
                      ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                       super_TestInstance.m_context);
  if (dVar1 != pVVar10->vendorID) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid header vendor ID!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6bf);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar1 = (this->m_header).DeviceID;
  pVVar10 = Context::getDeviceProperties
                      ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                       super_TestInstance.m_context);
  if (dVar1 != pVVar10->deviceID) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid header device ID!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6c2);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pVVar10 = Context::getDeviceProperties
                      ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                       super_TestInstance.m_context);
  iVar5 = deMemCmp((this->m_header).PipelineCacheUUID,pVVar10->pipelineCacheUUID,0x10);
  if (iVar5 != 0) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid header pipeline cache UUID!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x6c5);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

CacheHeaderTestInstance::CacheHeaderTestInstance (Context& context, const CacheTestParam* param)
	: GraphicsCacheTestInstance (context, param)
	, m_data                    (DE_NULL)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create more pipeline caches
	{
		// Create a cache with init data from m_cache
		size_t  dataSize = 0u;
		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL));

		if (dataSize < sizeof(m_header))
			TCU_THROW(TestError, "Pipeline cache size is smaller than header size");

		m_data = new deUint8[dataSize];
		DE_ASSERT(m_data);
		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data));

		deMemcpy(&m_header, m_data, sizeof(m_header));

		if (m_header.HeaderLength - VK_UUID_SIZE != 16)
			TCU_THROW(TestError, "Invalid header size!");

		if (m_header.HeaderVersion != 1)
			TCU_THROW(TestError, "Invalid header version!");

		if (m_header.VendorID != m_context.getDeviceProperties().vendorID)
			TCU_THROW(TestError, "Invalid header vendor ID!");

		if (m_header.DeviceID != m_context.getDeviceProperties().deviceID)
			TCU_THROW(TestError, "Invalid header device ID!");

		if (deMemCmp(&m_header.PipelineCacheUUID, &m_context.getDeviceProperties().pipelineCacheUUID, VK_UUID_SIZE) != 0)
			TCU_THROW(TestError, "Invalid header pipeline cache UUID!");
	}
}